

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_queue.c
# Opt level: O1

ngx_queue_t * ngx_queue_middle(ngx_queue_t *queue)

{
  ngx_queue_t *pnVar1;
  ngx_queue_t *pnVar2;
  
  pnVar1 = queue->next;
  pnVar2 = pnVar1;
  while( true ) {
    if (pnVar2 == queue->prev) {
      return pnVar1;
    }
    pnVar1 = pnVar1->next;
    if (pnVar2->next == queue->prev) break;
    pnVar2 = pnVar2->next->next;
  }
  return pnVar1;
}

Assistant:

ngx_queue_t *
ngx_queue_middle(ngx_queue_t *queue)
{
    ngx_queue_t  *middle, *next;

    middle = ngx_queue_head(queue);

    if (middle == ngx_queue_last(queue)) {
        return middle;
    }

    next = ngx_queue_head(queue);

    for ( ;; ) {
        middle = ngx_queue_next(middle);

        next = ngx_queue_next(next);

        if (next == ngx_queue_last(queue)) {
            return middle;
        }

        next = ngx_queue_next(next);

        if (next == ngx_queue_last(queue)) {
            return middle;
        }
    }
}